

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_get_http_var(mg_str *buf,char *name,char *dst,size_t dst_len)

{
  int iVar1;
  size_t len_00;
  char *pcVar2;
  char *src;
  int local_4c;
  int len;
  size_t name_len;
  char *s;
  char *e;
  char *p;
  size_t dst_len_local;
  char *dst_local;
  char *name_local;
  mg_str *buf_local;
  
  if ((dst == (char *)0x0) || (dst_len == 0)) {
    local_4c = -2;
  }
  else if (((buf->p == (char *)0x0) || (name == (char *)0x0)) || (buf->len == 0)) {
    local_4c = -1;
    *dst = '\0';
  }
  else {
    len_00 = strlen(name);
    pcVar2 = buf->p + buf->len;
    local_4c = -1;
    *dst = '\0';
    for (e = buf->p; e + len_00 < pcVar2; e = e + 1) {
      if (((e == buf->p) || (e[-1] == '&')) &&
         ((e[len_00] == '=' && (iVar1 = mg_ncasecmp(name,e,len_00), iVar1 == 0)))) {
        src = e + len_00 + 1;
        name_len = (size_t)memchr(src,0x26,(long)pcVar2 - (long)src);
        if ((void *)name_len == (void *)0x0) {
          name_len = (size_t)pcVar2;
        }
        iVar1 = mg_url_decode(src,(int)name_len - (int)src,dst,(int)dst_len,1);
        if (iVar1 != -1) {
          return iVar1;
        }
        return -2;
      }
    }
  }
  return local_4c;
}

Assistant:

int mg_get_http_var(const struct mg_str *buf, const char *name, char *dst,
                    size_t dst_len) {
    const char *p, *e, *s;
    size_t name_len;
    int len;

    if (dst == NULL || dst_len == 0) {
        len = -2;
    } else if (buf->p == NULL || name == NULL || buf->len == 0) {
        len = -1;
        dst[0] = '\0';
    } else {
        name_len = strlen(name);
        e = buf->p + buf->len;
        len = -1;
        dst[0] = '\0';

        for (p = buf->p; p + name_len < e; p++) {
            if ((p == buf->p || p[-1] == '&') && p[name_len] == '=' &&
                !mg_ncasecmp(name, p, name_len)) {
                p += name_len + 1;
                s = (const char *) memchr(p, '&', (size_t) (e - p));
                if (s == NULL) {
                    s = e;
                }
                len = mg_url_decode(p, (size_t) (s - p), dst, dst_len, 1);
                if (len == -1) {
                    len = -2;
                }
                break;
            }
        }
    }

    return len;
}